

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_def.c
# Opt level: O3

upb_FieldDef * upb_MessageDef_FindByJsonNameWithSize(upb_MessageDef *m,char *name,size_t size)

{
  _Bool _Var1;
  upb_value val;
  upb_value local_20;
  
  _Var1 = upb_strtable_lookup2(&m->jtof,name,size,&local_20);
  if (!_Var1) {
    _Var1 = upb_strtable_lookup2(&m->ntof,name,size,&local_20);
    if (_Var1) {
      local_20.val = (uint64_t)_upb_DefType_Unpack(local_20,UPB_DEFTYPE_EXT);
    }
    else {
      local_20.val = 0;
    }
  }
  return (upb_FieldDef *)local_20.val;
}

Assistant:

const upb_FieldDef* upb_MessageDef_FindByJsonNameWithSize(
    const upb_MessageDef* m, const char* name, size_t size) {
  upb_value val;

  if (upb_strtable_lookup2(&m->jtof, name, size, &val)) {
    return upb_value_getconstptr(val);
  }

  if (!upb_strtable_lookup2(&m->ntof, name, size, &val)) {
    return NULL;
  }

  return _upb_DefType_Unpack(val, UPB_DEFTYPE_FIELD);
}